

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void geomCallback(sqlite3_context *ctx,int nArg,sqlite3_value **aArg)

{
  int n;
  undefined8 *puVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 *z;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = (undefined8 *)ctx->pFunc->pUserData;
  n = nArg * 8 + 0x30;
  z = (undefined4 *)sqlite3_malloc(n);
  if (z != (undefined4 *)0x0) {
    *z = 0x891245ab;
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    *(undefined8 *)(z + 2) = *puVar1;
    *(undefined8 *)(z + 4) = uVar3;
    *(undefined8 *)(z + 6) = uVar4;
    *(undefined8 *)(z + 8) = uVar5;
    z[10] = nArg;
    uVar6 = 0;
    uVar7 = (ulong)(uint)nArg;
    if (nArg < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      dVar2 = sqlite3VdbeRealValue(aArg[uVar6]);
      *(double *)(z + uVar6 * 2 + 0xc) = dVar2;
    }
    sqlite3_result_blob(ctx,z,n,sqlite3_free);
    return;
  }
  sqlite3_result_error_nomem(ctx);
  return;
}

Assistant:

static void geomCallback(sqlite3_context *ctx, int nArg, sqlite3_value **aArg){
  RtreeGeomCallback *pGeomCtx = (RtreeGeomCallback *)sqlite3_user_data(ctx);
  RtreeMatchArg *pBlob;
  int nBlob;

  nBlob = sizeof(RtreeMatchArg) + (nArg-1)*sizeof(RtreeDValue);
  pBlob = (RtreeMatchArg *)sqlite3_malloc(nBlob);
  if( !pBlob ){
    sqlite3_result_error_nomem(ctx);
  }else{
    int i;
    pBlob->magic = RTREE_GEOMETRY_MAGIC;
    pBlob->cb = pGeomCtx[0];
    pBlob->nParam = nArg;
    for(i=0; i<nArg; i++){
#ifdef SQLITE_RTREE_INT_ONLY
      pBlob->aParam[i] = sqlite3_value_int64(aArg[i]);
#else
      pBlob->aParam[i] = sqlite3_value_double(aArg[i]);
#endif
    }
    sqlite3_result_blob(ctx, pBlob, nBlob, sqlite3_free);
  }
}